

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O2

void embree::renderTileTask
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  uint uVar1;
  uint height_00;
  uint y;
  uint y_00;
  uint uVar2;
  uint x;
  float extraout_XMM0_Da;
  
  height_00 = (uint)camera;
  uVar2 = (taskIndex % numTilesX) * 8 + 8;
  if (width <= uVar2) {
    uVar2 = width;
  }
  uVar1 = (taskIndex / numTilesX) * 8 + 8;
  y_00 = taskIndex / numTilesX << 3;
  if (uVar1 < height) {
    height = uVar1;
  }
  for (; uVar1 = taskIndex % numTilesX << 3, y_00 < height; y_00 = y_00 + 1) {
    for (; uVar1 < uVar2; uVar1 = uVar1 + 1) {
      renderPixelStandard((TutorialData *)data,uVar1,y_00,pixels,width,height_00,time,camera,
                          g_stats + threadIndex);
      time = extraout_XMM0_Da;
    }
  }
  return;
}

Assistant:

void renderTileTask (int taskIndex, int threadIndex, int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera,
                         const int numTilesX,
                         const int numTilesY)
{
  const unsigned int tileY = taskIndex / numTilesX;
  const unsigned int tileX = taskIndex - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    renderPixelStandard(data,x,y,pixels,width,height,time,camera,g_stats[threadIndex]);
  }
}